

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O1

IceTVoid * icetGetStateBuffer(IceTEnum pname,IceTSizeType num_bytes)

{
  IceTState pIVar1;
  IceTVoid *pIVar2;
  void *pvVar3;
  
  pIVar1 = icetGetState();
  if (pIVar1[pname].type == 0x800f) {
    pIVar1 = icetGetState();
    if (num_bytes <= pIVar1[pname].num_entries) {
      pvVar3 = icetUnsafeStateGet(pname,0x800f);
      return pvVar3;
    }
  }
  pIVar1 = icetGetState();
  if (pIVar1[pname].type != 0x800f) {
    pIVar1 = icetGetState();
    if (pIVar1[pname].type != 0) {
      icetRaiseDiagnostic("A non-buffer state variable is being reallocated as a state variable.  This is probably indicative of mixing up state variables."
                          ,0xffffffff,3,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/state.c"
                          ,0x2ab);
    }
  }
  pIVar1 = icetGetState();
  pIVar2 = stateAllocate(pname,num_bytes,0x800f,pIVar1);
  return pIVar2;
}

Assistant:

IceTVoid *icetGetStateBuffer(IceTEnum pname, IceTSizeType num_bytes)
{
    if (   (icetStateGetType(pname) == ICET_VOID)
        && (icetStateGetNumEntries(pname) >= num_bytes) ) {
      /* A big enough buffer is already allocated. */
        IceTVoid *buffer = icetUnsafeStateGet(pname, ICET_VOID);
#ifdef ICET_STATE_CHECK_MEM
        memset(buffer, 0xDC, num_bytes);
#endif
        return buffer;
    }

  /* Check to make sure this state variable has not been used for anything
   * besides a buffer. */
    if (   (icetStateGetType(pname) != ICET_VOID)
        && (icetStateGetType(pname) != ICET_NULL) ) {
        icetRaiseWarning("A non-buffer state variable is being reallocated as"
                         " a state variable.  This is probably indicative of"
                         " mixing up state variables.",
                         ICET_SANITY_CHECK_FAIL);
    }

    return stateAllocate(pname, num_bytes, ICET_VOID, icetGetState());
}